

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_operations.hpp
# Opt level: O0

rt_expression_interface<double> *
viennamath::diff_impl<viennamath::rt_expression_interface<double>>
          (rt_expression_interface<double> *param_1,
          op_rt_symbolic_integral<viennamath::rt_expression_interface<double>_> param_2,
          rt_expression_interface<double> *param_3)

{
  expression_not_differentiable_exception *this;
  allocator<char> local_41;
  string local_40;
  rt_expression_interface<double> *local_20;
  rt_expression_interface<double> *param_2_local;
  rt_expression_interface<double> *param_0_local;
  op_rt_symbolic_integral<viennamath::rt_expression_interface<double>_> param_1_local;
  
  local_20 = param_3;
  param_2_local = param_1;
  param_0_local = (rt_expression_interface<double> *)param_2.interval_.id_;
  this = (expression_not_differentiable_exception *)__cxa_allocate_exception(0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"Cannot differentiate runtime integration (yet)!",&local_41);
  expression_not_differentiable_exception::expression_not_differentiable_exception(this,&local_40);
  __cxa_throw(this,&expression_not_differentiable_exception::typeinfo,
              expression_not_differentiable_exception::~expression_not_differentiable_exception);
}

Assistant:

InterfaceType * diff_impl(const InterfaceType * /*e*/, op_rt_symbolic_integral<InterfaceType>, const InterfaceType * /*diff_var*/)
  {
    throw expression_not_differentiable_exception("Cannot differentiate runtime integration (yet)!");
    return NULL;
  }